

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDerivateTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::sr::anon_unknown_0::TriangleDerivateCaseInstance::iterate
          (TestStatus *__return_storage_ptr__,TriangleDerivateCaseInstance *this)

{
  TextureLevel *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  TestLog *this_01;
  int iVar4;
  ConstPixelBufferAccess *access;
  Surface *surface;
  void *__buf;
  void *__buf_00;
  void *data;
  Surface errorMask;
  TextureFormat dataFormat;
  TextureLevel resultImage;
  deUint16 indices [6];
  Surface local_1f8;
  undefined1 local_1e0 [32];
  void *local_1c0;
  LogImageSet local_1b8;
  string local_178;
  string local_158;
  TextureLevel local_138;
  deUint16 local_110 [8];
  LogImage local_100;
  string local_70;
  string local_50;
  
  this_01 = ((this->super_ShaderRenderCaseInstance).super_TestInstance.m_context)->m_testCtx->m_log;
  local_110[0] = 0;
  local_110[1] = 2;
  local_110[2] = 1;
  local_110[3] = 2;
  local_110[4] = 3;
  local_110[5] = 1;
  tcu::TextureLevel::TextureLevel(&local_138);
  (*(this->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance[4])(this);
  local_100.m_name._M_dataplus._M_p = (pointer)0x3e8000003e000000;
  local_100.m_name._M_string_length = 0x3f8000003f000000;
  ShaderRenderCaseInstance::render
            (&this->super_ShaderRenderCaseInstance,4,2,local_110,(Vec4 *)&local_100);
  this_00 = &(this->super_ShaderRenderCaseInstance).m_resultImage;
  if (this->m_definitions->surfaceType == SURFACETYPE_FLOAT_FBO) {
    local_178._M_dataplus._M_p = (pointer)0x2300000008;
    tcu::TextureLevel::setStorage
              (&local_138,(TextureFormat *)&local_178,
               (this->super_ShaderRenderCaseInstance).m_resultImage.m_size.m_data[0],
               (this->super_ShaderRenderCaseInstance).m_resultImage.m_size.m_data[1],1);
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_100,&local_138);
    tcu::TextureLevel::getAccess((ConstPixelBufferAccess *)local_1e0,this_00);
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              ((ConstPixelBufferAccess *)&local_1b8,(TextureFormat *)&local_178,
               &(this->super_ShaderRenderCaseInstance).m_resultImage.m_size,local_1c0);
    tcu::copy((EVP_PKEY_CTX *)&local_100,(EVP_PKEY_CTX *)&local_1b8);
  }
  else {
    local_138.m_size.m_data[2] =
         (this->super_ShaderRenderCaseInstance).m_resultImage.m_size.m_data[2];
    local_138.m_format = this_00->m_format;
    local_138.m_size.m_data._0_8_ =
         *(undefined8 *)(this->super_ShaderRenderCaseInstance).m_resultImage.m_size.m_data;
    de::ArrayBuffer<unsigned_char,_1UL,_1UL>::operator=
              (&local_138.m_data,&(this->super_ShaderRenderCaseInstance).m_resultImage.m_data);
  }
  tcu::Surface::Surface(&local_1f8,local_138.m_size.m_data[0],local_138.m_size.m_data[1]);
  local_1b8.m_name._M_dataplus._M_p = (pointer)0x300000008;
  data = (void *)local_1f8.m_pixels.m_cap;
  if ((void *)local_1f8.m_pixels.m_cap != (void *)0x0) {
    data = local_1f8.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&local_100,(TextureFormat *)&local_1b8,local_1f8.m_width,
             local_1f8.m_height,1,data);
  local_1e0._0_4_ = 0xff00ff00;
  tcu::RGBA::toVec((RGBA *)&local_1b8);
  tcu::clear((PixelBufferAccess *)&local_100,(Vec4 *)&local_1b8);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_100,&local_138);
  local_1e0._0_4_ = RGBA;
  local_1e0._4_4_ = UNORM_INT8;
  if ((void *)local_1f8.m_pixels.m_cap != (void *)0x0) {
    local_1f8.m_pixels.m_cap = (size_t)local_1f8.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&local_1b8,(TextureFormat *)local_1e0,local_1f8.m_width,
             local_1f8.m_height,1,(void *)local_1f8.m_pixels.m_cap);
  iVar4 = (*(this->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance[7])
                    (this,&local_100,&local_1b8);
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"Result","");
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"Result images","");
  tcu::LogImageSet::LogImageSet(&local_1b8,&local_178,&local_158);
  tcu::TestLog::startImageSet
            (this_01,local_1b8.m_name._M_dataplus._M_p,local_1b8.m_description._M_dataplus._M_p);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Rendered","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Rendered image","");
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)local_1e0,&local_138);
  access = (ConstPixelBufferAccess *)local_1e0;
  tcu::LogImage::LogImage(&local_100,&local_50,&local_70,access,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write(&local_100,(int)this_01,__buf,(size_t)access);
  paVar2 = &local_100.m_description.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_description._M_dataplus._M_p != paVar2) {
    operator_delete(local_100.m_description._M_dataplus._M_p,
                    local_100.m_description.field_2._M_allocated_capacity + 1);
  }
  paVar3 = &local_100.m_name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_name._M_dataplus._M_p != paVar3) {
    operator_delete(local_100.m_name._M_dataplus._M_p,
                    local_100.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8.m_description._M_dataplus._M_p != &local_1b8.m_description.field_2) {
    operator_delete(local_1b8.m_description._M_dataplus._M_p,
                    local_1b8.m_description.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_1b8.m_name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8.m_name._M_dataplus._M_p,
                    local_1b8.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  if ((char)iVar4 == '\0') {
    local_1b8.m_name._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"ErrorMask","");
    local_1e0._0_8_ = (long)local_1e0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"Error mask","");
    surface = &local_1f8;
    tcu::LogImage::LogImage
              (&local_100,&local_1b8.m_name,(string *)local_1e0,surface,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_100,(int)this_01,__buf_00,(size_t)surface);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100.m_description._M_dataplus._M_p != paVar2) {
      operator_delete(local_100.m_description._M_dataplus._M_p,
                      local_100.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100.m_name._M_dataplus._M_p != paVar3) {
      operator_delete(local_100.m_name._M_dataplus._M_p,
                      local_100.m_name.field_2._M_allocated_capacity + 1);
    }
    if (local_1e0._0_8_ != (long)local_1e0 + 0x10) {
      operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8.m_name._M_dataplus._M_p != paVar1) {
      operator_delete(local_1b8.m_name._M_dataplus._M_p,
                      local_1b8.m_name.field_2._M_allocated_capacity + 1);
    }
  }
  tcu::TestLog::endImageSet(this_01);
  local_100.m_name._M_dataplus._M_p = (pointer)paVar3;
  if ((char)iVar4 == '\0') {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_100,"Image comparison failed","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_100.m_name._M_dataplus._M_p,
               local_100.m_name._M_dataplus._M_p + local_100.m_name._M_string_length);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"Pass","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_100.m_name._M_dataplus._M_p,
               local_100.m_name._M_dataplus._M_p + local_100.m_name._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_name._M_dataplus._M_p != paVar3) {
    operator_delete(local_100.m_name._M_dataplus._M_p,
                    local_100.m_name.field_2._M_allocated_capacity + 1);
  }
  tcu::Surface::~Surface(&local_1f8);
  tcu::TextureLevel::~TextureLevel(&local_138);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus TriangleDerivateCaseInstance::iterate (void)
{
	tcu::TestLog&				log				= m_context.getTestContext().getLog();
	const deUint32				numVertices		= 4;
	const deUint32				numTriangles	= 2;
	const deUint16				indices[]		= { 0, 2, 1, 2, 3, 1 };
	tcu::TextureLevel			resultImage;

	setup();

	render(numVertices, numTriangles, indices);

	{
		const tcu::TextureLevel&		renderedImage	= getResultImage();

		if (m_definitions.surfaceType == SURFACETYPE_FLOAT_FBO)
		{
			const tcu::TextureFormat	dataFormat		(tcu::TextureFormat::RGBA, tcu::TextureFormat::FLOAT);

			resultImage.setStorage(dataFormat, renderedImage.getWidth(), renderedImage.getHeight());
			tcu::copy(resultImage.getAccess(), tcu::ConstPixelBufferAccess(dataFormat, renderedImage.getSize(), renderedImage.getAccess().getDataPtr()));
		}
		else
		{
			resultImage = renderedImage;
		}
	}

	// Verify
	{
		tcu::Surface errorMask(resultImage.getWidth(), resultImage.getHeight());
		tcu::clear(errorMask.getAccess(), tcu::RGBA::green().toVec());

		const bool isOk = verify(resultImage.getAccess(), errorMask.getAccess());

		log << TestLog::ImageSet("Result", "Result images")
			<< TestLog::Image("Rendered", "Rendered image", resultImage);

		if (!isOk)
			log << TestLog::Image("ErrorMask", "Error mask", errorMask);

		log << TestLog::EndImageSet;

		if (isOk)
			return tcu::TestStatus::pass("Pass");
		else
			return tcu::TestStatus::fail("Image comparison failed");
	}
}